

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

void __thiscall ot::commissioner::CommissionerImpl::CancelRequests(CommissionerImpl *this)

{
  int iVar1;
  
  coap::Coap::CancelRequests(&(this->mProxyClient).mCoap);
  coap::Coap::CancelRequests(&(this->mBrClient).mCoap);
  iVar1 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
  if ((char)iVar1 != '\0') {
    coap::Coap::CancelRequests(&(this->mTokenManager).mRegistrarClient.mCoap);
    return;
  }
  return;
}

Assistant:

void CommissionerImpl::CancelRequests()
{
    mProxyClient.CancelRequests();
    mBrClient.CancelRequests();

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        mTokenManager.CancelRequests();
    }
#endif
}